

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O3

ip_tables_t * parse_tables(char *path)

{
  list_head *plVar1;
  list_head *plVar2;
  code *pcVar3;
  _func_int_void_ptr_char_ptr_ptr *p_Var4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  FILE *__stream;
  ip_tables_t *piVar13;
  char *pcVar14;
  char *pcVar15;
  ip_chain_t *piVar16;
  ip_rule_t *ipr;
  ip_target_t *piVar17;
  size_t sVar18;
  long lVar19;
  void *pvVar20;
  byte bVar21;
  ip_target_map_t *piVar22;
  ip_match_map_t *piVar23;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar24;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar25;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  char name [32];
  char line [1024];
  ip_table_t *local_4c0;
  long *local_4b0;
  char *local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  char *local_488;
  char *local_480;
  in_addr *local_478;
  in_addr *local_470;
  in_addr *local_468;
  in_addr *local_460;
  list_head *local_458;
  list_head *local_450;
  char local_448 [17];
  undefined7 uStack_437;
  
  __stream = fopen(path,"r");
  memset(local_448 + 0x10,0,0x400);
  if (__stream == (FILE *)0x0) {
    piVar13 = (ip_tables_t *)0x0;
    _log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  else {
    piVar13 = (ip_tables_t *)new(0x20);
    pcVar14 = fgets(local_448 + 0x10,0x400,__stream);
    if (pcVar14 != (char *)0x0) {
      pcVar14 = local_448 + 0x10;
      local_4c0 = (ip_table_t *)0x0;
      bVar6 = false;
      do {
        while ((local_448[0x10] == '#' || (local_448[0x10] == '\n'))) {
          pcVar15 = fgets(pcVar14,0x400,__stream);
          if (pcVar15 == (char *)0x0) {
            return piVar13;
          }
        }
        bVar7 = false;
        if (CONCAT71(uStack_437,local_448[0x10]) != 0xa54494d4d4f43 || !bVar6) {
          if (local_448[0x10] == '*' && !bVar6) {
            local_4a8 = (char *)0x0;
            uStack_4a0 = 0;
            iVar10 = __isoc99_sscanf(pcVar14,"*%15s",&local_4a8);
            uVar24 = extraout_XMM0_Da_01;
            uVar25 = extraout_XMM0_Db_01;
            if (iVar10 == 1) {
              iVar10 = map_int_get_v((char *)&local_4a8,m_table);
              if (iVar10 != 4) {
                local_4c0 = (ip_table_t *)new(0x38);
                (local_4c0->child_chains).prev = &local_4c0->child_chains;
                (local_4c0->child_chains).next = &local_4c0->child_chains;
                piVar13->tables[iVar10] = local_4c0;
                goto LAB_001040e8;
              }
              dVar5 = _log((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
              uVar24 = SUB84(dVar5,0);
              uVar25 = (undefined4)((ulong)dVar5 >> 0x20);
            }
            bVar7 = false;
            _log((double)CONCAT44(uVar25,uVar24));
            local_4c0 = (ip_table_t *)0x0;
          }
          else if (local_448[0x10] == ':' && bVar6) {
            local_498 = 0;
            uStack_490 = 0;
            local_4a8 = (char *)0x0;
            uStack_4a0 = 0;
            local_448[0] = '\0';
            local_448[1] = '\0';
            local_448[2] = '\0';
            local_448[3] = '\0';
            local_448[4] = '\0';
            local_448[5] = '\0';
            local_448[6] = '\0';
            local_448[7] = '\0';
            local_448[8] = '\0';
            local_448[9] = '\0';
            local_448[10] = '\0';
            local_448[0xb] = '\0';
            local_448[0xc] = '\0';
            local_448[0xd] = '\0';
            local_448[0xe] = '\0';
            local_448[0xf] = '\0';
            iVar10 = __isoc99_sscanf(pcVar14,":%31s %15s",&local_4a8,local_448);
            uVar24 = extraout_XMM0_Da_00;
            uVar25 = extraout_XMM0_Db_00;
            if (iVar10 == 2) {
              piVar16 = (ip_chain_t *)new(0x48);
              _strlcpy((char *)piVar16,(char *)&local_4a8,0x20);
              iVar10 = map_int_get_v(local_448,m_target);
              piVar16->policy = iVar10;
              plVar2 = &piVar16->list;
              (piVar16->list).prev = plVar2;
              (piVar16->list).next = plVar2;
              (piVar16->rules).prev = &piVar16->rules;
              (piVar16->rules).next = &piVar16->rules;
              iVar10 = map_int_get_v((char *)piVar16,m_chain);
              if (iVar10 == 5) {
                plVar1 = (local_4c0->child_chains).prev;
                (local_4c0->child_chains).prev = plVar2;
                (piVar16->list).next = &local_4c0->child_chains;
                (piVar16->list).prev = plVar1;
                plVar1->next = plVar2;
              }
              else {
                local_4c0->chains[iVar10] = piVar16;
              }
LAB_001040e8:
              bVar7 = true;
            }
            else {
LAB_00104110:
              _log((double)CONCAT44(uVar25,uVar24));
              bVar7 = true;
            }
          }
          else {
            bVar7 = false;
            if (bVar6) {
              ipr = (ip_rule_t *)new(0x70);
              ipr->target = 6;
              local_450 = &ipr->list;
              (ipr->list).prev = local_450;
              (ipr->list).next = local_450;
              local_458 = &ipr->matchs;
              (ipr->matchs).prev = local_458;
              (ipr->matchs).next = local_458;
              pcVar15 = strtok(pcVar14," \t\n");
              if (pcVar15 == (char *)0x0) goto LAB_001040e8;
              local_480 = ipr->out;
              local_488 = ipr->in;
              local_460 = &ipr->dst;
              local_468 = &ipr->dmsk;
              local_470 = &ipr->src;
              local_478 = &ipr->smsk;
              local_4b0 = (long *)0x0;
              iVar10 = 0;
              uVar24 = extraout_XMM0_Da_03;
              uVar25 = extraout_XMM0_Db_03;
              do {
                local_4a8 = pcVar15;
                if (*pcVar15 != '-') {
                  iVar8 = iVar10;
                  if ((*pcVar15 == '!') && (pcVar15[1] == '\0')) {
                    iVar8 = 1;
                  }
                  goto switchD_00103cfd_caseD_65;
                }
                cVar9 = pcVar15[1];
                if ((cVar9 != '-') && (cVar9 != 'f')) {
                  local_4a8 = strtok((char *)0x0," \t\n");
                  uVar24 = extraout_XMM0_Da_05;
                  uVar25 = extraout_XMM0_Db_05;
                  if (local_4a8 != (char *)0x0) {
                    cVar9 = pcVar15[1];
                    goto LAB_00103cd6;
                  }
                  goto LAB_00104080;
                }
LAB_00103cd6:
                pcVar15 = local_4a8;
                iVar8 = 0;
                switch(cVar9) {
                case 'd':
                  iVar11 = parse_ip(local_4a8,local_460,local_468);
                  bVar21 = 2;
                  uVar24 = extraout_XMM0_Da_06;
                  uVar25 = extraout_XMM0_Db_06;
                  goto LAB_00103e5b;
                case 'e':
                case 'h':
                case 'k':
                case 'l':
                case 'n':
                case 'q':
                case 'r':
                  break;
                case 'f':
                  ipr->frag = '\x01';
                  bVar21 = 0x20;
                  goto LAB_00103efa;
                case 'g':
                  piVar16 = find_chain(local_4a8,local_4c0);
                  ipr->target_child = piVar16;
                  uVar24 = extraout_XMM0_Da_08;
                  uVar25 = extraout_XMM0_Db_08;
                  if (piVar16 == (ip_chain_t *)0x0) goto LAB_00104080;
                  ipr->target = 5;
                  ipr->go = '\x01';
                  break;
                case 'i':
                  sVar18 = strlen(local_4a8);
                  uVar24 = extraout_XMM0_Da_10;
                  uVar25 = extraout_XMM0_Db_10;
                  if (0xf < sVar18) goto LAB_00104080;
                  _strlcpy(local_488,pcVar15,0x10);
                  bVar21 = 4;
                  goto LAB_00103efa;
                case 'j':
                  iVar10 = map_int_get_v(local_4a8,m_target);
                  ipr->target = iVar10;
                  if (iVar10 == 6) {
                    if (g_target_map[0].name == (char *)0x0) {
LAB_00103fff:
                      piVar16 = find_chain(pcVar15,local_4c0);
                      ipr->target_child = piVar16;
                      if (piVar16 != (ip_chain_t *)0x0) {
                        ipr->target = 5;
                        break;
                      }
                      iVar10 = ipr->target;
                      uVar24 = extraout_XMM0_Da_17;
                      uVar25 = extraout_XMM0_Db_17;
                      if (iVar10 == 6) goto LAB_00104080;
                      goto LAB_00104039;
                    }
                    iVar10 = strcmp(pcVar15,g_target_map[0].name);
                    piVar22 = g_target_map;
                    if (iVar10 != 0) {
                      piVar22 = g_target_map;
                      do {
                        if (piVar22[1].name == (char *)0x0) goto LAB_00103fff;
                        iVar10 = strcmp(pcVar15,piVar22[1].name);
                        piVar22 = piVar22 + 1;
                      } while (iVar10 != 0);
                    }
                    piVar17 = (ip_target_t *)new(0x10);
                    ipr->target_ext = piVar17;
                    piVar17->map = piVar22;
                    pvVar20 = new(piVar22->data_size);
                    piVar17 = ipr->target_ext;
                    piVar17->data = pvVar20;
                    ipr->target = 4;
                  }
                  else {
LAB_00104039:
                    if ((iVar10 != 4) || (piVar17 = ipr->target_ext, piVar17 == (ip_target_t *)0x0))
                    break;
                  }
                  if ((piVar17->map != (ip_target_map_t *)0x0) &&
                     (p_Var4 = piVar17->map->func_parse,
                     p_Var4 != (_func_int_void_ptr_char_ptr_ptr *)0x0)) {
                    iVar10 = (*p_Var4)(piVar17->data,&local_4a8);
                    uVar24 = extraout_XMM0_Da_18;
                    uVar25 = extraout_XMM0_Db_18;
LAB_00104078:
                    iVar8 = 0;
                    if (iVar10 != 0) goto LAB_00104080;
                  }
                  break;
                case 'm':
                  if (g_match_map[0].name == (char *)0x0) goto LAB_00104080;
                  iVar10 = strcmp(local_4a8,g_match_map[0].name);
                  piVar23 = g_match_map;
                  if (iVar10 != 0) {
                    piVar23 = g_match_map;
                    uVar24 = extraout_XMM0_Da_14;
                    uVar25 = extraout_XMM0_Db_14;
                    do {
                      if (piVar23[1].name == (char *)0x0) goto LAB_00104080;
                      iVar10 = strcmp(pcVar15,piVar23[1].name);
                      piVar23 = piVar23 + 1;
                      uVar24 = extraout_XMM0_Da_15;
                      uVar25 = extraout_XMM0_Db_15;
                    } while (iVar10 != 0);
                  }
                  local_4b0 = (long *)new(0x20);
                  *local_4b0 = (long)piVar23;
                  pvVar20 = new(piVar23->data_size);
                  local_4b0[1] = (long)pvVar20;
                  plVar2 = (ipr->matchs).prev;
                  (ipr->matchs).prev = (list_head *)(local_4b0 + 2);
                  local_4b0[2] = (long)local_458;
                  local_4b0[3] = (long)plVar2;
                  plVar2->next = (list_head *)(local_4b0 + 2);
                  break;
                case 'o':
                  sVar18 = strlen(local_4a8);
                  uVar24 = extraout_XMM0_Da_11;
                  uVar25 = extraout_XMM0_Db_11;
                  if (0xf < sVar18) goto LAB_00104080;
                  _strlcpy(local_480,pcVar15,0x10);
                  bVar21 = 8;
                  goto LAB_00103efa;
                case 'p':
                  uVar12 = map_int_get_v(local_4a8,m_proto);
                  uVar24 = extraout_XMM0_Da_12;
                  uVar25 = extraout_XMM0_Db_12;
                  if (uVar12 == 0xffffffff) {
                    lVar19 = strtol(pcVar15,(char **)0x0,10);
                    uVar12 = (uint)lVar19;
                    uVar24 = extraout_XMM0_Da_13;
                    uVar25 = extraout_XMM0_Db_13;
                  }
                  if (0xff < uVar12) goto LAB_00104080;
                  ipr->proto = (uint8_t)uVar12;
                  bVar21 = 0x10;
                  goto LAB_00103efa;
                case 's':
                  iVar11 = parse_ip(local_4a8,local_470,local_478);
                  bVar21 = 1;
                  uVar24 = extraout_XMM0_Da_09;
                  uVar25 = extraout_XMM0_Db_09;
LAB_00103e5b:
                  if (iVar11 != 0) {
LAB_00104080:
                    _log((double)CONCAT44(uVar25,uVar24));
                    free_rule(ipr);
                    uVar24 = extraout_XMM0_Da_19;
                    uVar25 = extraout_XMM0_Db_19;
                    goto LAB_00104110;
                  }
LAB_00103efa:
                  if (iVar10 != 0) {
                    ipr->invert = ipr->invert | bVar21;
                  }
                  break;
                default:
                  if (cVar9 == '-') {
                    if (local_4b0 != (long *)0x0) {
                      if (*local_4b0 == 0) {
                        iVar8 = 0;
                        break;
                      }
                      pcVar3 = *(code **)(*local_4b0 + 0x18);
                      iVar8 = 0;
                      if (pcVar3 == (code *)0x0) break;
                      iVar10 = (*pcVar3)(local_4b0[1],&local_4a8,iVar10);
                      uVar24 = extraout_XMM0_Da_16;
                      uVar25 = extraout_XMM0_Db_16;
                      goto LAB_00104078;
                    }
                    local_4b0 = (long *)0x0;
                    iVar8 = 0;
                  }
                  else {
                    iVar8 = 0;
                    if (cVar9 == 'A') {
                      piVar16 = find_chain(local_4a8,local_4c0);
                      ipr->chain = piVar16;
                      uVar24 = extraout_XMM0_Da_07;
                      uVar25 = extraout_XMM0_Db_07;
                      if (piVar16 == (ip_chain_t *)0x0) goto LAB_00104080;
                      plVar2 = (piVar16->rules).prev;
                      (piVar16->rules).prev = local_450;
                      (ipr->list).next = &piVar16->rules;
                      (ipr->list).prev = plVar2;
                      plVar2->next = local_450;
                    }
                  }
                }
switchD_00103cfd_caseD_65:
                iVar10 = iVar8;
                pcVar15 = strtok((char *)0x0," \t\n");
                uVar24 = extraout_XMM0_Da_04;
                uVar25 = extraout_XMM0_Db_04;
              } while (pcVar15 != (char *)0x0);
              bVar7 = true;
              if (ipr == (ip_rule_t *)0x0) goto LAB_00104110;
            }
          }
        }
        pcVar15 = fgets(pcVar14,0x400,__stream);
        bVar6 = bVar7;
      } while (pcVar15 != (char *)0x0);
    }
  }
  return piVar13;
}

Assistant:

ip_tables_t *parse_tables(const char *path)
{
	FILE *fp = fopen(path, "r");
	char line[1024] = {0};
	int line_num = 0, in_table = 0;

	ip_tables_t *ipts = NULL;
	ip_table_t *ipt = NULL;

	if (fp == NULL) {
		log_err("open file \"%s\" failed: %m\n", path);
		return NULL;
	}

	ipts = _new(ip_tables_t);

	while (fgets(line, sizeof(line), fp) != NULL) {
		line_num++;

		if (line[0] == '#' || line[0] == '\n') {
			continue;

		} else if (strcmp(line, "COMMIT\n") == 0 && in_table) {
			in_table = 0;

		} else if (line[0] == '*' && !in_table) {
			if ((ipt = parse_table(line, ipts)) == NULL) {
				log_err("line: %d parse table failed\n", line_num);
			} else {
				in_table = 1;
			}

		} else if (line[0] == ':' && in_table) {
			if (parse_chain(line, ipt) == NULL) {
				log_err("line: %d parse chain failed\n", line_num);
			}

		} else if (in_table) {
			if (parse_rule(line, ipt) == NULL) {
				log_err("line: %d parse rule failed\n", line_num);
			}
		}
	}

	return ipts;
}